

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O3

void device_render(int *pixels,uint width,uint height,float time,ISPCCamera *camera)

{
  ostream *poVar1;
  
  if (embree::pause == '\0') {
    embree::updateScene();
  }
  if ((embree::benchmark == '\x01') && (embree::cur_time == 0x80)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"collision time = ",0x11);
    poVar1 = std::ostream::_M_insert<double>(embree::total_collision_time * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void device_render (int* pixels,
                           const unsigned int width,
                           const unsigned int height,
                           const float time,
                           const ISPCCamera& camera)
{

  if (!pause) updateScene();
  //else PRINT(cur_time);

  if (benchmark && cur_time == 128) {
    std::cout << "collision time = " << 1000.0f*total_collision_time << " ms" << std::endl;
  }
}